

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O1

void __thiscall amrex::BaseFab<unsigned_int>::clear(BaseFab<unsigned_int> *this)

{
  long n;
  
  if (this->dptr != (uint *)0x0) {
    if (this->ptr_owner == true) {
      if (this->shared_memory == true) {
        Abort_host("BaseFab::clear: BaseFab cannot be owner of shared memory");
      }
      DataAllocator::free(&this->super_DataAllocator,this->dptr);
      n = 0;
      if (1 < (long)this->nvar) {
        n = -this->truesize / (long)this->nvar;
      }
      update_fab_stats(n,-this->truesize,4);
    }
    this->dptr = (uint *)0x0;
    this->truesize = 0;
  }
  return;
}

Assistant:

void
BaseFab<T>::clear () noexcept
{
    if (this->dptr)
    {
        //
        // Call T::~T() on the to-be-destroyed memory.
        //
        if (this->ptr_owner)
        {
            if (this->shared_memory)
            {
                amrex::Abort("BaseFab::clear: BaseFab cannot be owner of shared memory");
            }

            placementDelete(this->dptr, this->truesize);

            this->free(this->dptr);

            if (this->nvar > 1) {
                amrex::update_fab_stats(-this->truesize/this->nvar, -this->truesize, sizeof(T));
            } else {
                amrex::update_fab_stats(0, -this->truesize, sizeof(T));
            }
        }

        this->dptr = 0;
        this->truesize = 0;
    }
}